

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_int32_suite::test_array8_int32(void)

{
  value vVar1;
  undefined4 uVar2;
  value_type expected [8];
  value_type input [10];
  decoder decoder;
  undefined8 local_70;
  value local_68 [2];
  uchar local_60 [16];
  decoder local_50;
  
  local_50.input._M_str = local_60;
  local_60[0] = 0xac;
  local_60[1] = '\b';
  local_60[2] = '\x11';
  local_60[3] = '\"';
  local_60[4] = '3';
  local_60[5] = 'D';
  local_60[6] = 'U';
  local_60[7] = 'f';
  local_60[8] = 'w';
  local_60[9] = 0x88;
  local_50.input._M_len = 10;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_70._0_4_ = local_50.current.code;
  local_68[0] = array8_int32;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array8_int32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x867,"void compact_int32_suite::test_array8_int32()",&local_70,local_68);
  local_70._0_4_ = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_68[0] = error_expected_end_record;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x868,"void compact_int32_suite::test_array8_int32()",&local_70,local_68);
  vVar1 = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  uVar2 = 0;
  if (vVar1 - null < 0xc) {
    uVar2 = *(undefined4 *)(&DAT_00124a00 + (ulong)(vVar1 - null) * 4);
  }
  local_70 = CONCAT44(local_70._4_4_,uVar2);
  local_68[0] = error_unexpected_token;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x869,"void compact_int32_suite::test_array8_int32()",&local_70,local_68);
  local_70 = 0x8877665544332211;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x870,"void compact_int32_suite::test_array8_int32()",local_50.current.view._M_str,
             local_50.current.view._M_str + local_50.current.view._M_len,&local_70,local_68);
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_68[0] = local_50.current.code;
  local_68[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x872,"void compact_int32_suite::test_array8_int32()",local_68,local_68 + 1);
  return;
}

Assistant:

void test_array8_int32()
{
    const value_type input[] = { token::code::array8_int32, 0x08, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array8_int32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x11, 0x22, 0x33, 0x44,
        0x55, 0x66, 0x77, 0x88
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}